

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_finalize(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  global_State *g_00;
  GCobj *o_00;
  long in_RDI;
  TValue *tv;
  TValue tmp;
  cTValue *mo;
  GCobj *o;
  global_State *g;
  GCstr *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  GCtab *in_stack_ffffffffffffff78;
  cTValue *L_00;
  GCobj *in_stack_ffffffffffffff80;
  uint uVar3;
  cTValue *in_stack_ffffffffffffff88;
  undefined4 uVar4;
  lua_State *in_stack_ffffffffffffff90;
  
  uVar2 = (ulong)*(uint *)(in_RDI + 8);
  uVar3 = *(uint *)(ulong)*(uint *)(uVar2 + 0x44);
  g_00 = (global_State *)(ulong)uVar3;
  if (g_00 == (global_State *)(ulong)*(uint *)(uVar2 + 0x44)) {
    *(undefined4 *)(uVar2 + 0x44) = 0;
  }
  else {
    *(uint32_t *)(ulong)*(uint *)(uVar2 + 0x44) = ((GCRef *)&g_00->strhash)->gcptr32;
  }
  if (*(uint8_t *)((long)((GCRef *)&g_00->strhash + 1) + 1) == '\n') {
    ((GCRef *)&g_00->strhash)->gcptr32 = *(uint32_t *)(uVar2 + 0x30);
    *(uint *)(uVar2 + 0x30) = uVar3;
    *(byte *)((GCRef *)&g_00->strhash + 1) =
         *(byte *)((GCRef *)&g_00->strhash + 1) & 0xf8 | *(byte *)(uVar2 + 0x28) & 3;
    *(byte *)((GCRef *)&g_00->strhash + 1) = *(byte *)((GCRef *)&g_00->strhash + 1) & 0xef;
    uVar4 = 0xfffffff5;
    o_00 = (GCobj *)lj_tab_set((lua_State *)g_00,(GCtab *)in_stack_ffffffffffffff90,
                               in_stack_ffffffffffffff88);
    iVar1._0_1_ = *(uint8_t *)((long)o_00 + 4);
    iVar1._1_1_ = *(uint8_t *)((long)o_00 + 5);
    iVar1._2_1_ = *(uint8_t *)((long)o_00 + 6);
    iVar1._3_1_ = *(uint8_t *)((long)o_00 + 7);
    if (iVar1 != -1) {
      *(undefined1 *)(uVar2 + 0x2a) = 0;
      *(uint8_t *)((long)o_00 + 4) = 0xff;
      *(uint8_t *)((long)o_00 + 5) = 0xff;
      *(uint8_t *)((long)o_00 + 6) = 0xff;
      *(uint8_t *)((long)o_00 + 7) = 0xff;
      gc_call_finalizer(g_00,in_stack_ffffffffffffff90,(cTValue *)o_00->cd,o_00);
    }
  }
  else {
    ((GCRef *)&g_00->strhash)->gcptr32 = *(uint32_t *)(ulong)*(uint *)(uVar2 + 0x94);
    *(uint *)(ulong)*(uint *)(uVar2 + 0x94) = uVar3;
    *(byte *)((GCRef *)&g_00->strhash + 1) =
         *(byte *)((GCRef *)&g_00->strhash + 1) & 0xf8 | *(byte *)(uVar2 + 0x28) & 3;
    if (*(int *)&g_00->allocf == 0) {
      L_00 = (cTValue *)0x0;
    }
    else if ((*(byte *)((ulong)*(uint *)&g_00->allocf + 6) & 4) == 0) {
      L_00 = lj_meta_cache(in_stack_ffffffffffffff78,(MMS)((ulong)in_stack_ffffffffffffff70 >> 0x20)
                           ,in_stack_ffffffffffffff68);
    }
    else {
      L_00 = (cTValue *)0x0;
    }
    if (L_00 != (cTValue *)0x0) {
      gc_call_finalizer(g_00,(lua_State *)&L_00->field_2,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80);
    }
  }
  return;
}

Assistant:

static void gc_finalize(lua_State *L)
{
  global_State *g = G(L);
  GCobj *o = gcnext(gcref(g->gc.mmudata));
  cTValue *mo;
  lua_assert(gcref(g->jit_L) == NULL);  /* Must not be called on trace. */
  /* Unchain from list of userdata to be finalized. */
  if (o == gcref(g->gc.mmudata))
    setgcrefnull(g->gc.mmudata);
  else
    setgcrefr(gcref(g->gc.mmudata)->gch.nextgc, o->gch.nextgc);
#if LJ_HASFFI
  if (o->gch.gct == ~LJ_TCDATA) {
    TValue tmp, *tv;
    /* Add cdata back to the GC list and make it white. */
    setgcrefr(o->gch.nextgc, g->gc.root);
    setgcref(g->gc.root, o);
    makewhite(g, o);
    o->gch.marked &= (uint8_t)~LJ_GC_CDATA_FIN;
    /* Resolve finalizer. */
    setcdataV(L, &tmp, gco2cd(o));
    tv = lj_tab_set(L, ctype_ctsG(g)->finalizer, &tmp);
    if (!tvisnil(tv)) {
      g->gc.nocdatafin = 0;
      copyTV(L, &tmp, tv);
      setnilV(tv);  /* Clear entry in finalizer table. */
      gc_call_finalizer(g, L, &tmp, o);
    }
    return;
  }
#endif
  /* Add userdata back to the main userdata list and make it white. */
  setgcrefr(o->gch.nextgc, mainthread(g)->nextgc);
  setgcref(mainthread(g)->nextgc, o);
  makewhite(g, o);
  /* Resolve the __gc metamethod. */
  mo = lj_meta_fastg(g, tabref(gco2ud(o)->metatable), MM_gc);
  if (mo)
    gc_call_finalizer(g, L, mo, o);
}